

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void cmUVReadOnlyProcess::UVExit(uv_process_t *handle,int64_t exitStatus,int termSignal)

{
  cmUVReadOnlyProcess *this;
  ProcessResultT *this_00;
  bool bVar1;
  string sStack_38;
  
  this = (cmUVReadOnlyProcess *)handle->data;
  if (this->IsStarted_ != true) {
    return;
  }
  if (this->IsFinished_ != false) {
    return;
  }
  this_00 = (this->Setup_).Result;
  this_00->ExitStatus = exitStatus;
  this_00->TermSignal = termSignal;
  bVar1 = cmWorkerPool::ProcessResultT::error(this_00);
  if (!bVar1) {
    if (termSignal == 0) {
      if (exitStatus == 0) goto LAB_001ad218;
      std::__cxx11::string::assign((char *)&((this->Setup_).Result)->ErrorMessage);
      std::__cxx11::to_string(&sStack_38,((this->Setup_).Result)->ExitStatus);
      std::__cxx11::string::append((string *)&((this->Setup_).Result)->ErrorMessage);
    }
    else {
      std::__cxx11::string::assign((char *)&((this->Setup_).Result)->ErrorMessage);
      std::__cxx11::to_string(&sStack_38,((this->Setup_).Result)->TermSignal);
      std::__cxx11::string::append((string *)&((this->Setup_).Result)->ErrorMessage);
    }
    std::__cxx11::string::~string((string *)&sStack_38);
  }
LAB_001ad218:
  ::cm::uv_handle_ptr_base_<uv_process_s>::reset
            ((uv_handle_ptr_base_<uv_process_s> *)&this->UVProcess_);
  UVTryFinish(this);
  return;
}

Assistant:

void cmUVReadOnlyProcess::UVExit(uv_process_t* handle, int64_t exitStatus,
                                 int termSignal)
{
  auto& proc = *reinterpret_cast<cmUVReadOnlyProcess*>(handle->data);
  if (proc.IsStarted() && !proc.IsFinished()) {
    // Set error message on demand
    proc.Result()->ExitStatus = exitStatus;
    proc.Result()->TermSignal = termSignal;
    if (!proc.Result()->error()) {
      if (termSignal != 0) {
        proc.Result()->ErrorMessage = "Process was terminated by signal ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->TermSignal);
      } else if (exitStatus != 0) {
        proc.Result()->ErrorMessage = "Process failed with return value ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->ExitStatus);
      }
    }

    // Reset process handle
    proc.UVProcess_.reset();
    // Try finish
    proc.UVTryFinish();
  }
}